

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintFloat_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,float val)

{
  undefined1 local_38 [8];
  StringBaseTextGenerator generator;
  
  generator.super_BaseTextGenerator._vptr_BaseTextGenerator =
       (_func_int **)&generator.output_._M_string_length;
  local_38 = (undefined1  [8])&PTR__StringBaseTextGenerator_003e3318;
  generator.output_._M_dataplus._M_p = (pointer)0x0;
  generator.output_._M_string_length._0_1_ = 0;
  FastFieldValuePrinter::PrintFloat
            ((FastFieldValuePrinter *)__return_storage_ptr__,val,(BaseTextGenerator *)local_38);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&generator);
  anon_unknown_20::StringBaseTextGenerator::~StringBaseTextGenerator
            ((StringBaseTextGenerator *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintFloat(float val) const {
  FORWARD_IMPL(PrintFloat, val);
}